

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::ListOp<long>::~ListOp(ListOp<long> *this)

{
  ListOp<long> *this_local;
  
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->ordered_items);
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->deleted_items);
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->appended_items);
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->prepended_items);
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->added_items);
  ::std::vector<long,_std::allocator<long>_>::~vector(&this->explicit_items);
  return;
}

Assistant:

ListOp() : is_explicit(false) {}